

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Connection::Connection
          (Connection *this,uint64_t insertionOrder,uint64_t src,uint64_t dest,string *prop,
          Document *doc)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  uint64_t local_40;
  uint64_t local_38;
  
  this->insertionOrder = insertionOrder;
  local_40 = dest;
  local_38 = src;
  std::__cxx11::string::string((string *)&this->prop,(string *)prop);
  this->src = src;
  this->dest = dest;
  this->doc = doc;
  cVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>,_std::_Select1st<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
          ::find(&(doc->objects)._M_t,&local_38);
  p_Var2 = &(doc->objects)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node == p_Var2) {
    __assert_fail("doc.Objects().find(src) != doc.Objects().end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                  ,0x2a0,
                  "Assimp::FBX::Connection::Connection(uint64_t, uint64_t, uint64_t, const std::string &, const Document &)"
                 );
  }
  if (dest != 0) {
    cVar1 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>,_std::_Select1st<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Assimp::FBX::LazyObject_*>_>_>
            ::find(&(doc->objects)._M_t,&local_40);
    if ((_Rb_tree_header *)cVar1._M_node == p_Var2) {
      __assert_fail("!dest || doc.Objects().find(dest) != doc.Objects().end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXDocument.cpp"
                    ,0x2a2,
                    "Assimp::FBX::Connection::Connection(uint64_t, uint64_t, uint64_t, const std::string &, const Document &)"
                   );
    }
  }
  return;
}

Assistant:

Connection::Connection(uint64_t insertionOrder,  uint64_t src, uint64_t dest, const std::string& prop,
        const Document& doc)

: insertionOrder(insertionOrder)
, prop(prop)
, src(src)
, dest(dest)
, doc(doc)
{
    ai_assert(doc.Objects().find(src) != doc.Objects().end());
    // dest may be 0 (root node)
    ai_assert(!dest || doc.Objects().find(dest) != doc.Objects().end());
}